

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O2

void cnn::TensorTools::Randomize(Tensor *d)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  
  auVar2 = in_ZMM0._0_16_;
  uVar1 = Dim::sum_dims(&d->d);
  auVar2 = vcvtusi2sd_avx512f(auVar2,uVar1);
  auVar2 = vsqrtsd_avx(auVar2,auVar2);
  Randomize(d,(float)(2.449489742783178 / auVar2._0_8_));
  return;
}

Assistant:

void TensorTools::Randomize(Tensor& d) {
  Randomize(d, sqrt(6) / sqrt(d.d.sum_dims()));
}